

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_atomic_counters_limit
               (NegativeTestContext *ctx)

{
  int iVar1;
  ostream *poVar2;
  RenderContext *renderCtx;
  ProgramSources *sources;
  allocator<char> local_559;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  ShaderSource local_4d8;
  ProgramSources local_4b0;
  undefined1 local_3e0 [8];
  ShaderProgram program;
  undefined1 local_300 [8];
  ostringstream shaderBody;
  ostringstream shaderDecl;
  NegativeTestContext *ctx_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
  poVar2 = std::operator<<((ostream *)&shaderBody.field_0x170,
                           "layout(binding = 0, offset = 0) uniform atomic_uint u_atomic0;\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0, offset = ");
  iVar1 = getResourceLimit(ctx,0x8265);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(long)iVar1 << 2);
  poVar2 = std::operator<<(poVar2,") uniform atomic_uint u_atomic1;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0) buffer Output {\n");
  poVar2 = std::operator<<(poVar2,"    uint value;\n");
  std::operator<<(poVar2,"} sb_out;\n");
  poVar2 = std::operator<<((ostream *)local_300,"    uint oldVal = 0u;\n");
  poVar2 = std::operator<<(poVar2,"    oldVal = atomicCounterIncrement(u_atomic0);\n");
  poVar2 = std::operator<<(poVar2,"    oldVal = atomicCounterIncrement(u_atomic1);\n");
  std::operator<<(poVar2,"    sb_out.value = oldVal;\n");
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_4b0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateComputeShader(&local_4f8,ctx,&local_518,&local_538);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_4d8,&local_4f8);
  sources = glu::ProgramSources::operator<<(&local_4b0,&local_4d8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3e0,renderCtx,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  glu::ProgramSources::~ProgramSources(&local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_ATOMIC_COUNTERS.",
             &local_559);
  NegativeTestContext::beginSection(ctx,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  verifyLinkError(ctx,(ShaderProgram *)local_3e0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody.field_0x170);
  return;
}

Assistant:

void exceed_atomic_counters_limit (NegativeTestContext& ctx)
{
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(binding = 0, offset = 0) uniform atomic_uint u_atomic0;\n"
				<< "layout(binding = 0, offset = " << sizeof(GLuint) * getResourceLimit(ctx, GL_MAX_COMPUTE_ATOMIC_COUNTERS) << ") uniform atomic_uint u_atomic1;\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    uint value;\n"
				<< "} sb_out;\n";

	shaderBody	<< "    uint oldVal = 0u;\n"
				<< "    oldVal = atomicCounterIncrement(u_atomic0);\n"
				<< "    oldVal = atomicCounterIncrement(u_atomic1);\n"
				<< "    sb_out.value = oldVal;\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_ATOMIC_COUNTERS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}